

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginListBox(char *label,ImVec2 *size_arg)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiID id;
  ImGuiContext *g;
  uint uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImRect frame_bb;
  ImRect bb;
  ImRect local_98;
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  undefined8 uStack_70;
  ImVec2 local_60;
  ImRect local_58;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  pIVar3 = GImGui;
  GImGui->CurrentWindow->WriteAccessed = true;
  pIVar1 = pIVar3->CurrentWindow;
  if (pIVar1->SkipItems == false) {
    id = GetID(label);
    IVar2 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_78 = IVar2.y;
    local_88._8_4_ = extraout_XMM0_Dc;
    local_88._0_4_ = IVar2.x;
    local_88._4_4_ = IVar2.y;
    local_88._12_4_ = extraout_XMM0_Dd;
    uStack_70 = CONCAT44(local_78,local_78);
    local_48 = *size_arg;
    uStack_40 = 0;
    fStack_74 = local_78;
    fVar7 = CalcItemWidth();
    fVar8 = GetTextLineHeightWithSpacing();
    fVar9 = (pIVar3->Style).FramePadding.y;
    IVar2 = CalcItemSize(local_48,fVar7,fVar9 + fVar9 + fVar8 * 7.25);
    uVar5 = -(uint)(local_78 <= (float)(int)IVar2.y);
    local_98.Min.x = (pIVar1->DC).CursorPos.x;
    local_98.Min.y = (pIVar1->DC).CursorPos.y;
    local_98.Max.x = (float)(int)IVar2.x + local_98.Min.x;
    local_98.Max.y =
         (float)(uVar5 & (uint)(float)(int)IVar2.y | ~uVar5 & (uint)local_78) + local_98.Min.y;
    local_58.Max.x = 0.0;
    if (0.0 < (float)local_88._0_4_) {
      local_58.Max.x = (pIVar3->Style).ItemInnerSpacing.x + (float)local_88._0_4_;
    }
    local_58.Max.x = local_58.Max.x + local_98.Max.x;
    local_58.Max.y = local_98.Max.y + 0.0;
    (pIVar3->NextItemData).Flags = 0;
    local_58.Min.x = local_98.Min.x;
    local_58.Min.y = local_98.Min.y;
    bVar4 = IsRectVisible(&local_58.Min,&local_58.Max);
    if (bVar4) {
      BeginGroup();
      if (0.0 < (float)local_88._0_4_) {
        local_78 = (pIVar3->Style).ItemInnerSpacing.x + local_98.Max.x;
        fStack_74 = (pIVar3->Style).FramePadding.y + local_98.Min.y;
        uStack_70 = 0;
        IVar2.y = fStack_74;
        IVar2.x = local_78;
        RenderText(IVar2,label,(char *)0x0,true);
        IVar2 = (pIVar1->DC).CursorMaxPos;
        fVar9 = IVar2.x;
        fVar7 = IVar2.y;
        uVar5 = -(uint)((float)local_88._0_4_ + local_78 <= fVar9);
        uVar6 = -(uint)((float)local_88._4_4_ + fStack_74 <= fVar7);
        (pIVar1->DC).CursorMaxPos =
             (ImVec2)(CONCAT44(~uVar6 & (uint)((float)local_88._4_4_ + fStack_74),
                               ~uVar5 & (uint)((float)local_88._0_4_ + local_78)) |
                     CONCAT44((uint)fVar7 & uVar6,(uint)fVar9 & uVar5));
      }
      local_60.x = local_98.Max.x - local_98.Min.x;
      local_60.y = local_98.Max.y - local_98.Min.y;
      BeginChildFrame(id,&local_60,0);
    }
    else {
      local_60.x = local_58.Max.x - local_58.Min.x;
      local_60.y = local_58.Max.y - local_58.Min.y;
      ItemSize(&local_60,(pIVar3->Style).FramePadding.y);
      ItemAdd(&local_58,0,&local_98,0);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ImGui::BeginListBox(const char* label, const ImVec2& size_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    // Size default to hold ~7.25 items.
    // Fractional number of items helps seeing that we can scroll down/up without looking at scrollbar.
    ImVec2 size = ImFloor(CalcItemSize(size_arg, CalcItemWidth(), GetTextLineHeightWithSpacing() * 7.25f + style.FramePadding.y * 2.0f));
    ImVec2 frame_size = ImVec2(size.x, ImMax(size.y, label_size.y));
    ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    ImRect bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    g.NextItemData.ClearFlags();

    if (!IsRectVisible(bb.Min, bb.Max))
    {
        ItemSize(bb.GetSize(), style.FramePadding.y);
        ItemAdd(bb, 0, &frame_bb);
        return false;
    }

    // FIXME-OPT: We could omit the BeginGroup() if label_size.x but would need to omit the EndGroup() as well.
    BeginGroup();
    if (label_size.x > 0.0f)
    {
        ImVec2 label_pos = ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y);
        RenderText(label_pos, label);
        window->DC.CursorMaxPos = ImMax(window->DC.CursorMaxPos, label_pos + label_size);
    }

    BeginChildFrame(id, frame_bb.GetSize());
    return true;
}